

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strncpy_s( s, 8, "", 1 ) == 0 );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strncpy_s( s, 8, abcde, 6 ) == 0 );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'x' );
    TESTCASE( strncpy_s( s, 8, abcde, 7 ) == 0 );
    /* Different from strncpy()! */
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'x' );
    TESTCASE( strncpy_s( s, 8, "xxxx", 3 ) == 0 );
    TESTCASE( s[0] == 'x' );
    TESTCASE( s[2] == 'x' );
    TESTCASE( s[3] == 'd' );

    /* Overrun. */
    TESTCASE( strncpy_s( s, 8, "abcdefgh", 9 ) != 0 );
    TESTCASE( strncpy_s( s, 8, "abcdefgh", 9 ) != 0 );

    TESTCASE( HANDLER_CALLS == 2 );
#endif
    return TEST_RESULTS;
}